

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_line_directive
          (CompilerGLSL *this,uint32_t file_id,uint32_t line_literal)

{
  SPIRString *pSVar1;
  allocator local_39;
  string local_38;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t line_literal_local;
  uint32_t file_id_local;
  CompilerGLSL *this_local;
  
  if (((this->redirect_statement ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) && ((this->block_debug_directives & 1U) == 0)) &&
     (((this->options).emit_line_directives & 1U) != 0)) {
    local_18 = line_literal;
    local_14 = file_id;
    _line_literal_local = this;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_38,"GL_GOOGLE_cpp_style_line_directive",&local_39);
    require_extension_internal(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pSVar1 = Compiler::get<spirv_cross::SPIRString>(&this->super_Compiler,local_14);
    statement_no_indent<char_const(&)[7],unsigned_int&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [7])"#line ",&local_18,(char (*) [3])" \"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar1->str,
               (char (*) [2])0x682995);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_line_directive(uint32_t file_id, uint32_t line_literal)
{
	// If we are redirecting statements, ignore the line directive.
	// Common case here is continue blocks.
	if (redirect_statement)
		return;

	// If we're emitting code in a sensitive context such as condition blocks in for loops, don't emit
	// any line directives, because it's not possible.
	if (block_debug_directives)
		return;

	if (options.emit_line_directives)
	{
		require_extension_internal("GL_GOOGLE_cpp_style_line_directive");
		statement_no_indent("#line ", line_literal, " \"", get<SPIRString>(file_id).str, "\"");
	}
}